

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-chest.c
# Opt level: O1

_Bool do_cmd_disarm_chest(object *obj)

{
  bool bVar1;
  bool bVar2;
  _Bool _Var3;
  uint32_t uVar4;
  bool bVar5;
  chest_trap *pcVar6;
  int iVar7;
  char *fmt;
  int iVar8;
  
  if (chest_traps == (chest_trap *)0x0) {
    bVar2 = false;
    bVar5 = false;
  }
  else {
    bVar1 = false;
    bVar5 = false;
    bVar2 = false;
    pcVar6 = chest_traps;
    do {
      if ((pcVar6->pval & (int)obj->pval) != 0) {
        if (pcVar6->magic == false) {
          bVar2 = true;
          bVar5 = bVar1;
        }
        else {
          bVar1 = true;
          bVar5 = true;
        }
      }
      pcVar6 = pcVar6->next;
    } while (pcVar6 != (chest_trap *)0x0);
  }
  iVar7 = (player->state).skills[0];
  iVar8 = iVar7;
  if ((bVar5) && (iVar8 = (player->state).skills[1], bVar2)) {
    iVar8 = (iVar8 + iVar7) / 2;
  }
  if ((player->timed[2] != 0) || (_Var3 = no_light(player), _Var3)) {
    iVar8 = iVar8 / 10;
  }
  if ((player->timed[4] != 0) || (player->timed[6] != 0)) {
    iVar8 = iVar8 / 10;
  }
  iVar8 = iVar8 - obj->pval;
  iVar7 = 2;
  if (2 < iVar8) {
    iVar7 = iVar8;
  }
  if ((obj->known->pval == 0) || (_Var3 = ignore_item_ok(player,obj), _Var3)) {
    fmt = "I don\'t see any traps.";
  }
  else {
    _Var3 = tval_is_chest(obj);
    if ((_Var3) && (1 < obj->pval)) {
      uVar4 = Rand_div(100);
      if ((int)uVar4 < iVar7) {
        msgt(0x58,"You have disarmed the chest.");
        player_exp_gain(player,(int)obj->pval);
        obj->pval = -obj->pval;
        return false;
      }
      uVar4 = Rand_div(100);
      if ((int)uVar4 < iVar7) {
        event_signal(EVENT_INPUT_FLUSH);
        msg("You failed to disarm the chest.");
        return true;
      }
      _Var3 = player_is_trapsafe(player);
      if (_Var3) {
        _Var3 = player_of_has(player,L'$');
        if (_Var3) {
          equip_learn_flag(player,L'$');
        }
        return false;
      }
      msg("You set off a trap!");
      chest_trap(obj);
      return false;
    }
    fmt = "The chest is not trapped.";
  }
  msg(fmt);
  return false;
}

Assistant:

bool do_cmd_disarm_chest(struct object *obj)
{
	int skill = player->state.skills[SKILL_DISARM_PHYS], diff;
	struct chest_trap *traps;
	bool physical = false;
	bool magic = false;
	bool more = false;

	/* Check whether the traps are magic, physical or both */
	for (traps = chest_traps; traps; traps = traps->next) {
		if (!(traps->pval & obj->pval)) continue;
		if (traps->magic) {
			magic = true;
		} else {
			physical = true;
		}
	}

	/* Physical disarming is the default, if there are magic traps we adjust */ 
	if (magic) {
		if (physical) {
			skill = (player->state.skills[SKILL_DISARM_MAGIC] +
					 player->state.skills[SKILL_DISARM_PHYS]) / 2;
		} else {
			skill = player->state.skills[SKILL_DISARM_MAGIC];
		}
	}

	/* Penalize some conditions */
	if (player->timed[TMD_BLIND] || no_light(player)) {
		skill /= 10;
	}
	if (player->timed[TMD_CONFUSED] || player->timed[TMD_IMAGE]) {
		skill /= 10;
	}

	/* Extract the difficulty */
	diff = skill - obj->pval;

	/* Always have a small chance of success */
	if (diff < 2) diff = 2;

	/* Must find the trap first. */
	if (!obj->known->pval || ignore_item_ok(player, obj)) {
		msg("I don't see any traps.");
	} else if (!is_trapped_chest(obj)) {
		/* Already disarmed/unlocked or no traps */
		msg("The chest is not trapped.");
	} else if (randint0(100) < diff) {
		/* Success (get a lot of experience) */
		msgt(MSG_DISARM, "You have disarmed the chest.");
		player_exp_gain(player, obj->pval);
		obj->pval = (0 - obj->pval);
	} else if (randint0(100) < diff) {
		/* Failure -- Keep trying */
		more = true;
		event_signal(EVENT_INPUT_FLUSH);
		msg("You failed to disarm the chest.");
	} else {
		/* Failure -- Set off the trap */
		if (!player_is_trapsafe(player)) {
			msg("You set off a trap!");
			chest_trap(obj);
		} else if (player_of_has(player, OF_TRAP_IMMUNE)) {
			/* Learn trap immunity. */
			equip_learn_flag(player, OF_TRAP_IMMUNE);
		}
	}

	/* Result */
	return (more);
}